

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall
CTcParser::add_gen_obj_prop(CTcParser *this,CTcSymObj *obj,char *propn,CTcConstVal *val)

{
  CTcVMIfc *pCVar1;
  tctarg_prop_id_t tVar2;
  tc_symtype_t tVar3;
  uint uVar4;
  CTcPrsSymtab *this_00;
  CTcSymPropBase *this_01;
  ulong uVar5;
  CTcConstVal *in_RCX;
  char *in_RDX;
  CTcSymObjBase *in_RSI;
  CTcParser *in_RDI;
  CTcSymProp *prop;
  CTcSymbol *sym;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  this_00 = get_global_symtab(G_prs);
  strlen(in_RDX);
  this_01 = (CTcSymPropBase *)
            CTcPrsSymtab::find_or_def_prop_explicit
                      (this_00,(char *)in_RDI,
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  if ((this_01 != (CTcSymPropBase *)0x0) &&
     (tVar3 = CTcSymbolBase::get_type((CTcSymbolBase *)this_01), pCVar1 = G_vmifc,
     tVar3 == TC_SYM_PROP)) {
    if (G_vmifc == (CTcVMIfc *)0x0) {
      add_gen_obj_prop_stat(in_RDI,(CTcSymObj *)in_RSI,(CTcSymProp *)this_01,in_RCX);
    }
    else {
      uVar5 = CTcSymObjBase::get_obj_id(in_RSI);
      uVar4 = (uint)uVar5;
      tVar2 = CTcSymPropBase::get_prop(this_01);
      (*pCVar1->_vptr_CTcVMIfc[4])(pCVar1,(ulong)uVar4,(ulong)tVar2,in_RCX);
    }
  }
  return;
}

Assistant:

void CTcParser::add_gen_obj_prop(
    CTcSymObj *obj, const char *propn, const CTcConstVal *val)
{
    /* look up the property - this counts as an explicit definition */
    CTcSymbol *sym = G_prs->get_global_symtab()
                     ->find_or_def_prop_explicit(propn, strlen(propn), FALSE);

    /* make sure we found it, and that it's a property symbol */
    if (sym != 0 && sym->get_type() == TC_SYM_PROP)
    {
        /* it's a property symbol - cast it */
        CTcSymProp *prop = (CTcSymProp *)sym;

        /* check for dynamic compilation */
        if (G_vmifc != 0)
        {
            /* dynamic mode - add it to the live object in the VM */
            G_vmifc->set_prop(obj->get_obj_id(), prop->get_prop(), val);
        }
        else
        {            
            /* static compilation - add the value to the object statement */
            add_gen_obj_prop_stat(obj, prop, val);
        }
    }
}